

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_api_dump.cpp
# Opt level: O2

bool ApiDumpOutputXrStruct
               (XrGeneratedDispatchTable *gen_dispatch_table,XrSceneFrustumBoundMSFT *value,
               string *prefix,string *type_string,bool is_pointer,
               vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *contents)

{
  bool bVar1;
  invalid_argument *piVar2;
  XrGeneratedDispatchTable *pXVar3;
  XrSceneFrustumBoundMSFT *in_stack_fffffffffffffd58;
  string fardistance_prefix;
  string fov_prefix;
  string pose_prefix;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_240;
  undefined1 local_220 [32];
  string local_200;
  undefined1 local_1e0 [32];
  string local_1c0;
  ostringstream oss_farDistance;
  undefined8 local_198 [46];
  
  PointerToHexString<XrSceneFrustumBoundMSFT>(in_stack_fffffffffffffd58);
  std::
  vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
  ::emplace_back<std::__cxx11::string&,std::__cxx11::string&,std::__cxx11::string>
            ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
              *)contents,type_string,prefix,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&oss_farDistance);
  std::__cxx11::string::~string((string *)&oss_farDistance);
  std::__cxx11::string::append((char *)prefix);
  std::__cxx11::string::string((string *)&pose_prefix,(string *)prefix);
  std::__cxx11::string::append((char *)&pose_prefix);
  std::__cxx11::string::string((string *)(local_1e0 + 0x20),(string *)&pose_prefix);
  pXVar3 = (XrGeneratedDispatchTable *)local_1e0;
  std::__cxx11::string::string((string *)pXVar3,"XrPosef",(allocator *)&oss_farDistance);
  bVar1 = ApiDumpOutputXrStruct
                    (pXVar3,&value->pose,(string *)(local_1e0 + 0x20),(string *)local_1e0,false,
                     contents);
  std::__cxx11::string::~string((string *)local_1e0);
  std::__cxx11::string::~string((string *)(local_1e0 + 0x20));
  if (!bVar1) {
    piVar2 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(piVar2,"Invalid Operation");
    __cxa_throw(piVar2,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  std::__cxx11::string::string((string *)&fov_prefix,(string *)prefix);
  std::__cxx11::string::append((char *)&fov_prefix);
  std::__cxx11::string::string((string *)(local_220 + 0x20),(string *)&fov_prefix);
  pXVar3 = (XrGeneratedDispatchTable *)local_220;
  std::__cxx11::string::string((string *)pXVar3,"XrFovf",(allocator *)&oss_farDistance);
  bVar1 = ApiDumpOutputXrStruct
                    (pXVar3,&value->fov,(string *)(local_220 + 0x20),(string *)local_220,false,
                     contents);
  std::__cxx11::string::~string((string *)local_220);
  std::__cxx11::string::~string((string *)(local_220 + 0x20));
  if (bVar1) {
    std::__cxx11::string::string((string *)&fardistance_prefix,(string *)prefix);
    std::__cxx11::string::append((char *)&fardistance_prefix);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss_farDistance);
    *(undefined8 *)((long)local_198 + *(long *)(_oss_farDistance + -0x18)) = 0x20;
    std::ostream::operator<<((ostream *)&oss_farDistance,value->farDistance);
    std::__cxx11::stringbuf::str();
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[6],std::__cxx11::string&,std::__cxx11::string>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)contents,(char (*) [6])"float",&fardistance_prefix,&local_240);
    std::__cxx11::string::~string((string *)&local_240);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&oss_farDistance);
    std::__cxx11::string::~string((string *)&fardistance_prefix);
    std::__cxx11::string::~string((string *)&fov_prefix);
    std::__cxx11::string::~string((string *)&pose_prefix);
    return true;
  }
  piVar2 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(piVar2,"Invalid Operation");
  __cxa_throw(piVar2,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

bool ApiDumpOutputXrStruct(XrGeneratedDispatchTable* gen_dispatch_table, const XrSceneFrustumBoundMSFT* value,
                           std::string prefix, std::string type_string, bool is_pointer,
                           std::vector<std::tuple<std::string, std::string, std::string>> &contents) {
    (void)gen_dispatch_table;  // silence warning
    try {
        contents.emplace_back(type_string, prefix, PointerToHexString(value));
        if (is_pointer) {
            prefix += "->";
        } else {
            prefix += ".";
        }
        std::string pose_prefix = prefix;
        pose_prefix += "pose";
        if (!ApiDumpOutputXrStruct(gen_dispatch_table, &value->pose, pose_prefix, "XrPosef", false, contents)) {
            throw std::invalid_argument("Invalid Operation");
        }
        std::string fov_prefix = prefix;
        fov_prefix += "fov";
        if (!ApiDumpOutputXrStruct(gen_dispatch_table, &value->fov, fov_prefix, "XrFovf", false, contents)) {
            throw std::invalid_argument("Invalid Operation");
        }
        std::string fardistance_prefix = prefix;
        fardistance_prefix += "farDistance";
        std::ostringstream oss_farDistance;
        oss_farDistance << std::setprecision(32) << (value->farDistance);
        contents.emplace_back("float", fardistance_prefix, oss_farDistance.str());
        return true;
    } catch(...) {
    }
    return false;
}